

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void toggle_sourceview_cb(Fl_Double_Window *param_1,void *param_2)

{
  _func_int **pp_Var1;
  Fl_Tabs *this;
  char cVar2;
  Fl_Widget **ppFVar3;
  char *pcVar4;
  Fl_Button *pFVar5;
  int tab;
  int autoposition;
  int autorefresh;
  Fl_Preferences svp;
  int local_3c;
  int local_38;
  int local_34;
  Fl_Preferences local_30;
  
  if (sourceview_panel == (Fl_Double_Window *)0x0) {
    make_sourceview();
    (sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.callback_ =
         toggle_sourceview_cb;
    Fl_Preferences::Fl_Preferences(&local_30,&fluid_prefs,"sourceview");
    Fl_Preferences::get(&local_30,"autorefresh",&local_34,1);
    Fl_Button::value(&sv_autorefresh->super_Fl_Button,local_34);
    Fl_Preferences::get(&local_30,"autoposition",&local_38,1);
    Fl_Button::value(&sv_autoposition->super_Fl_Button,local_38);
    Fl_Preferences::get(&local_30,"tab",&local_3c,0);
    this = sv_tab;
    if ((-1 < (long)local_3c) && (local_3c < (sv_tab->super_Fl_Group).children_)) {
      ppFVar3 = Fl_Group::array(&sv_tab->super_Fl_Group);
      Fl_Tabs::value(this,ppFVar3[local_3c]);
    }
    pcVar4 = "sourceview_pos";
    cVar2 = position_window(&sourceview_panel->super_Fl_Window,"sourceview_pos",0,0x140,0x78,0x226,
                            500);
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_30);
    param_2 = pcVar4;
    if (cVar2 == '\0') {
      return;
    }
  }
  pp_Var1 = (sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget;
  if (((sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_ & 2) == 0) {
    (*pp_Var1[6])();
    sourceview_item->text = "Show Source Code...";
  }
  else {
    pFVar5 = (Fl_Button *)sourceview_panel;
    (*pp_Var1[5])();
    sourceview_item->text = "Hide Source Code...";
    update_sourceview_cb(pFVar5,param_2);
  }
  return;
}

Assistant:

void toggle_sourceview_cb(Fl_Double_Window *, void *) {
  if (!sourceview_panel) {
    make_sourceview();
    sourceview_panel->callback((Fl_Callback*)toggle_sourceview_cb);
    Fl_Preferences svp(fluid_prefs, "sourceview");
    int autorefresh;
    svp.get("autorefresh", autorefresh, 1);
    sv_autorefresh->value(autorefresh);
    int autoposition;
    svp.get("autoposition", autoposition, 1);
    sv_autoposition->value(autoposition);
    int tab;
    svp.get("tab", tab, 0);
    if (tab>=0 && tab<sv_tab->children()) sv_tab->value(sv_tab->child(tab));
    if (!position_window(sourceview_panel,"sourceview_pos", 0, 320, 120, 550, 500)) return;
  }

  if (sourceview_panel->visible()) {
    sourceview_panel->hide();
    sourceview_item->label("Show Source Code...");
  } else {
    sourceview_panel->show();
    sourceview_item->label("Hide Source Code...");
    update_sourceview_cb(0,0);
  }
}